

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O0

string * __thiscall
cmRulePlaceholderExpander::ExpandVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,string *variable)

{
  cmOutputConverter *pcVar1;
  bool bVar2;
  char *pcVar3;
  string *this_00;
  mapped_type *pmVar4;
  ulong uVar5;
  long lVar6;
  pointer ppVar7;
  string_view sVar8;
  cmAlphaNum local_478;
  cmAlphaNum local_448;
  string local_418;
  undefined1 local_3f1;
  _Self local_3f0;
  _Self local_3e8;
  iterator mapIt;
  string local_3d0;
  string local_3b0 [8];
  string sysroot;
  string local_380;
  cmAlphaNum local_360;
  cmAlphaNum local_330;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  mapped_type *local_2a0;
  string *compilerOptionSysroot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  mapped_type *local_258;
  string *compilerOptionExternalToolchain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  mapped_type *local_210;
  string *compilerExternalToolchain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  mapped_type *local_1c8;
  string *compilerOptionTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  mapped_type *local_180;
  string *compilerTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  mapped_type *local_138;
  string *compilerArg1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  byte local_e9;
  _Self local_e8;
  _Self local_e0;
  iterator compIt;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  undefined4 local_bc;
  long local_b8;
  size_type pos;
  string local_a8 [8];
  string targetBase;
  string local_80 [32];
  ulong local_60;
  size_type sz;
  allocator<char> local_50;
  undefined1 local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  string *local_20;
  string *variable_local;
  cmRulePlaceholderExpander *this_local;
  string *targetQuoted;
  
  local_20 = variable;
  variable_local = (string *)this;
  this_local = (cmRulePlaceholderExpander *)__return_storage_ptr__;
  if ((this->ReplaceValues->LinkFlags == (char *)0x0) ||
     (bVar2 = std::operator==(variable,"LINK_FLAGS"), !bVar2)) {
    if ((this->ReplaceValues->Manifests == (char *)0x0) ||
       (bVar2 = std::operator==(local_20,"MANIFESTS"), !bVar2)) {
      if ((this->ReplaceValues->Flags == (char *)0x0) ||
         (bVar2 = std::operator==(local_20,"FLAGS"), !bVar2)) {
        if ((this->ReplaceValues->Source == (char *)0x0) ||
           (bVar2 = std::operator==(local_20,"SOURCE"), !bVar2)) {
          if ((this->ReplaceValues->DynDepFile == (char *)0x0) ||
             (bVar2 = std::operator==(local_20,"DYNDEP_FILE"), !bVar2)) {
            if ((this->ReplaceValues->PreprocessedSource == (char *)0x0) ||
               (bVar2 = std::operator==(local_20,"PREPROCESSED_SOURCE"), !bVar2)) {
              if ((this->ReplaceValues->AssemblySource == (char *)0x0) ||
                 (bVar2 = std::operator==(local_20,"ASSEMBLY_SOURCE"), !bVar2)) {
                if ((this->ReplaceValues->Object == (char *)0x0) ||
                   (bVar2 = std::operator==(local_20,"OBJECT"), !bVar2)) {
                  if ((this->ReplaceValues->ObjectDir == (char *)0x0) ||
                     (bVar2 = std::operator==(local_20,"OBJECT_DIR"), !bVar2)) {
                    if ((this->ReplaceValues->ObjectFileDir == (char *)0x0) ||
                       (bVar2 = std::operator==(local_20,"OBJECT_FILE_DIR"), !bVar2)) {
                      if ((this->ReplaceValues->Objects == (char *)0x0) ||
                         (bVar2 = std::operator==(local_20,"OBJECTS"), !bVar2)) {
                        if ((this->ReplaceValues->ObjectsQuoted == (char *)0x0) ||
                           (bVar2 = std::operator==(local_20,"OBJECTS_QUOTED"), !bVar2)) {
                          if ((this->ReplaceValues->CudaCompileMode == (char *)0x0) ||
                             (bVar2 = std::operator==(local_20,"CUDA_COMPILE_MODE"), !bVar2)) {
                            if ((this->ReplaceValues->AIXExports == (char *)0x0) ||
                               (bVar2 = std::operator==(local_20,"AIX_EXPORTS"), !bVar2)) {
                              if ((this->ReplaceValues->ISPCHeader == (char *)0x0) ||
                                 (bVar2 = std::operator==(local_20,"ISPC_HEADER"), !bVar2)) {
                                if ((this->ReplaceValues->Defines == (char *)0x0) ||
                                   (bVar2 = std::operator==(local_20,"DEFINES"), !bVar2)) {
                                  if ((this->ReplaceValues->Includes == (char *)0x0) ||
                                     (bVar2 = std::operator==(local_20,"INCLUDES"), !bVar2)) {
                                    if ((this->ReplaceValues->SwiftLibraryName == (char *)0x0) ||
                                       (bVar2 = std::operator==(local_20,"SWIFT_LIBRARY_NAME"),
                                       !bVar2)) {
                                      if ((this->ReplaceValues->SwiftModule == (char *)0x0) ||
                                         (bVar2 = std::operator==(local_20,"SWIFT_MODULE"), !bVar2))
                                      {
                                        if ((this->ReplaceValues->SwiftModuleName == (char *)0x0) ||
                                           (bVar2 = std::operator==(local_20,"SWIFT_MODULE_NAME"),
                                           !bVar2)) {
                                          if ((this->ReplaceValues->SwiftSources == (char *)0x0) ||
                                             (bVar2 = std::operator==(local_20,"SWIFT_SOURCES"),
                                             !bVar2)) {
                                            if ((this->ReplaceValues->TargetPDB == (char *)0x0) ||
                                               (bVar2 = std::operator==(local_20,"TARGET_PDB"),
                                               !bVar2)) {
                                              if ((this->ReplaceValues->TargetCompilePDB ==
                                                   (char *)0x0) ||
                                                 (bVar2 = std::operator==(local_20,
                                                  "TARGET_COMPILE_PDB"), !bVar2)) {
                                                if ((this->ReplaceValues->DependencyFile ==
                                                     (char *)0x0) ||
                                                   (bVar2 = std::operator==(local_20,"DEP_FILE"),
                                                   !bVar2)) {
                                                  if ((this->ReplaceValues->DependencyTarget ==
                                                       (char *)0x0) ||
                                                     (bVar2 = std::operator==(local_20,"DEP_TARGET")
                                                     , !bVar2)) {
                                                    if ((this->ReplaceValues->Fatbinary ==
                                                         (char *)0x0) ||
                                                       (bVar2 = std::operator==(local_20,"FATBINARY"
                                                                               ), !bVar2)) {
                                                      if ((this->ReplaceValues->RegisterFile ==
                                                           (char *)0x0) ||
                                                         (bVar2 = std::operator==(local_20,
                                                  "REGISTER_FILE"), !bVar2)) {
                                                    if (this->ReplaceValues->Target != (char *)0x0)
                                                    {
                                                      bVar2 = std::operator==(local_20,
                                                  "TARGET_QUOTED");
                                                  if (bVar2) {
                                                    local_4f = 0;
                                                    pcVar3 = this->ReplaceValues->Target;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_50);
                                                    std::allocator<char>::~allocator(&local_50);
                                                    uVar5 = std::__cxx11::string::empty();
                                                    if ((uVar5 & 1) != 0) {
                                                      return __return_storage_ptr__;
                                                    }
                                                    pcVar3 = (char *)std::__cxx11::string::front();
                                                    if (*pcVar3 == '\"') {
                                                      return __return_storage_ptr__;
                                                    }
                                                    std::__cxx11::string::operator=
                                                              ((string *)__return_storage_ptr__,'\"'
                                                              );
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               this->ReplaceValues->Target);
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,'\"'
                                                              );
                                                    return __return_storage_ptr__;
                                                  }
                                                  bVar2 = std::operator==(local_20,"TARGET_UNQUOTED"
                                                                         );
                                                  if (bVar2) {
                                                    sz._7_1_ = 0;
                                                    pcVar3 = this->ReplaceValues->Target;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,(allocator<char> *)
                                                                      ((long)&sz + 6));
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)((long)&sz + 6));
                                                    local_60 = std::__cxx11::string::size();
                                                    if (local_60 < 3) {
                                                      return __return_storage_ptr__;
                                                    }
                                                    pcVar3 = (char *)std::__cxx11::string::front();
                                                    if (*pcVar3 != '\"') {
                                                      return __return_storage_ptr__;
                                                    }
                                                    pcVar3 = (char *)std::__cxx11::string::back();
                                                    if (*pcVar3 != '\"') {
                                                      return __return_storage_ptr__;
                                                    }
                                                    std::__cxx11::string::substr
                                                              ((ulong)local_80,
                                                               (ulong)__return_storage_ptr__);
                                                    std::__cxx11::string::operator=
                                                              ((string *)__return_storage_ptr__,
                                                               local_80);
                                                    std::__cxx11::string::~string(local_80);
                                                    return __return_storage_ptr__;
                                                  }
                                                  if ((this->ReplaceValues->LanguageCompileFlags !=
                                                       (char *)0x0) &&
                                                     (bVar2 = std::operator==(local_20,
                                                  "LANGUAGE_COMPILE_FLAGS"), bVar2)) {
                                                    pcVar3 = this->ReplaceValues->
                                                             LanguageCompileFlags;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,(allocator<char> *)
                                                                      (targetBase.field_2.
                                                                       _M_local_buf + 0xf));
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               (targetBase.field_2._M_local_buf +
                                                               0xf));
                                                    return __return_storage_ptr__;
                                                  }
                                                  if ((this->ReplaceValues->Target != (char *)0x0)
                                                     && (bVar2 = std::operator==(local_20,"TARGET"),
                                                        bVar2)) {
                                                    pcVar3 = this->ReplaceValues->Target;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,(allocator<char> *)
                                                                      (targetBase.field_2.
                                                                       _M_local_buf + 0xe));
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               (targetBase.field_2._M_local_buf +
                                                               0xe));
                                                    return __return_storage_ptr__;
                                                  }
                                                  bVar2 = std::operator==(local_20,"TARGET_IMPLIB");
                                                  if (bVar2) {
                                                    std::__cxx11::string::string
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)&this->TargetImpLib);
                                                    return __return_storage_ptr__;
                                                  }
                                                  bVar2 = std::operator==(local_20,
                                                  "TARGET_VERSION_MAJOR");
                                                  if (bVar2) {
                                                    if (this->ReplaceValues->TargetVersionMajor !=
                                                        (char *)0x0) {
                                                      pcVar3 = this->ReplaceValues->
                                                               TargetVersionMajor;
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)__return_storage_ptr__,
                                                                 pcVar3,(allocator<char> *)
                                                                        (targetBase.field_2.
                                                                         _M_local_buf + 0xd));
                                                      std::allocator<char>::~allocator
                                                                ((allocator<char> *)
                                                                 (targetBase.field_2._M_local_buf +
                                                                 0xd));
                                                      return __return_storage_ptr__;
                                                    }
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,"0",
                                                               (allocator<char> *)
                                                               (targetBase.field_2._M_local_buf +
                                                               0xc));
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               (targetBase.field_2._M_local_buf +
                                                               0xc));
                                                    return __return_storage_ptr__;
                                                  }
                                                  bVar2 = std::operator==(local_20,
                                                  "TARGET_VERSION_MINOR");
                                                  if (bVar2) {
                                                    if (this->ReplaceValues->TargetVersionMinor !=
                                                        (char *)0x0) {
                                                      pcVar3 = this->ReplaceValues->
                                                               TargetVersionMinor;
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)__return_storage_ptr__,
                                                                 pcVar3,(allocator<char> *)
                                                                        (targetBase.field_2.
                                                                         _M_local_buf + 0xb));
                                                      std::allocator<char>::~allocator
                                                                ((allocator<char> *)
                                                                 (targetBase.field_2._M_local_buf +
                                                                 0xb));
                                                      return __return_storage_ptr__;
                                                    }
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,"0",
                                                               (allocator<char> *)
                                                               (targetBase.field_2._M_local_buf + 10
                                                               ));
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               (targetBase.field_2._M_local_buf + 10
                                                               ));
                                                    return __return_storage_ptr__;
                                                  }
                                                  if ((this->ReplaceValues->Target != (char *)0x0)
                                                     && (bVar2 = std::operator==(local_20,
                                                  "TARGET_BASE"), bVar2)) {
                                                    pcVar3 = this->ReplaceValues->Target;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_a8,pcVar3,
                                                               (allocator<char> *)((long)&pos + 7));
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)((long)&pos + 7));
                                                    local_b8 = std::__cxx11::string::rfind
                                                                         ((char)local_a8,0x2e);
                                                    if (local_b8 == -1) {
                                                      std::__cxx11::string::string
                                                                ((string *)__return_storage_ptr__,
                                                                 local_a8);
                                                    }
                                                    else {
                                                      std::__cxx11::string::substr
                                                                ((ulong)__return_storage_ptr__,
                                                                 (ulong)local_a8);
                                                    }
                                                    local_bc = 1;
                                                    std::__cxx11::string::~string(local_a8);
                                                    return __return_storage_ptr__;
                                                  }
                                                  }
                                                  bVar2 = std::operator==(local_20,"TARGET_SONAME");
                                                  if (((bVar2) ||
                                                      (bVar2 = std::operator==(local_20,
                                                  "SONAME_FLAG"), bVar2)) ||
                                                  (bVar2 = std::operator==(local_20,
                                                  "TARGET_INSTALLNAME_DIR"), bVar2)) {
                                                    if (this->ReplaceValues->TargetSOName !=
                                                        (char *)0x0) {
                                                      bVar2 = std::operator==(local_20,
                                                  "TARGET_SONAME");
                                                  if (bVar2) {
                                                    pcVar3 = this->ReplaceValues->TargetSOName;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_bd);
                                                    std::allocator<char>::~allocator(&local_bd);
                                                    return __return_storage_ptr__;
                                                  }
                                                  bVar2 = std::operator==(local_20,"SONAME_FLAG");
                                                  if ((bVar2) &&
                                                     (this->ReplaceValues->SONameFlag != (char *)0x0
                                                     )) {
                                                    pcVar3 = this->ReplaceValues->SONameFlag;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_be);
                                                    std::allocator<char>::~allocator(&local_be);
                                                    return __return_storage_ptr__;
                                                  }
                                                  if ((this->ReplaceValues->TargetInstallNameDir !=
                                                       (char *)0x0) &&
                                                     (bVar2 = std::operator==(local_20,
                                                  "TARGET_INSTALLNAME_DIR"), bVar2)) {
                                                    pcVar3 = this->ReplaceValues->
                                                             TargetInstallNameDir;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_bf);
                                                    std::allocator<char>::~allocator(&local_bf);
                                                    return __return_storage_ptr__;
                                                  }
                                                  }
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)__return_storage_ptr__,"",
                                                             &local_c0);
                                                  std::allocator<char>::~allocator(&local_c0);
                                                  }
                                                  else if ((this->ReplaceValues->LinkLibraries ==
                                                            (char *)0x0) ||
                                                          (bVar2 = std::operator==(local_20,
                                                  "LINK_LIBRARIES"), !bVar2)) {
                                                    if ((this->ReplaceValues->Language ==
                                                         (char *)0x0) ||
                                                       (bVar2 = std::operator==(local_20,"LANGUAGE")
                                                       , !bVar2)) {
                                                      if ((this->ReplaceValues->CMTargetName ==
                                                           (char *)0x0) ||
                                                         (bVar2 = std::operator==(local_20,
                                                  "TARGET_NAME"), !bVar2)) {
                                                    if ((this->ReplaceValues->CMTargetType ==
                                                         (char *)0x0) ||
                                                       (bVar2 = std::operator==(local_20,
                                                  "TARGET_TYPE"), !bVar2)) {
                                                    if ((this->ReplaceValues->Output == (char *)0x0)
                                                       || (bVar2 = std::operator==(local_20,"OUTPUT"
                                                                                  ), !bVar2)) {
                                                      bVar2 = std::operator==(local_20,
                                                  "CMAKE_COMMAND");
                                                  if (bVar2) {
                                                    pcVar1 = this->OutputConverter;
                                                    this_00 = cmSystemTools::
                                                              GetCMakeCommand_abi_cxx11_();
                                                    sVar8 = (string_view)
                                                            std::__cxx11::string::
                                                            operator_cast_to_basic_string_view
                                                                      ((string *)this_00);
                                                    compIt._M_node = (_Base_ptr)sVar8._M_len;
                                                    cmOutputConverter::
                                                    ConvertToOutputFormat_abi_cxx11_
                                                              (__return_storage_ptr__,pcVar1,sVar8,
                                                               SHELL);
                                                  }
                                                  else {
                                                    local_e0._M_node =
                                                         (_Base_ptr)
                                                         std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::find(&this->Compilers,local_20);
                                                  local_e8._M_node =
                                                       (_Base_ptr)
                                                       std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::end(&this->Compilers);
                                                  bVar2 = std::operator!=(&local_e0,&local_e8);
                                                  if (bVar2) {
                                                    local_e9 = 0;
                                                    pcVar1 = this->OutputConverter;
                                                    ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerArg1,"CMAKE_",&ppVar7->second);
                                                  std::operator+(&local_110,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerArg1,"_COMPILER");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_110);
                                                  cmOutputConverter::ConvertToOutputForExisting
                                                            (__return_storage_ptr__,pcVar1,pmVar4,
                                                             SHELL);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_110);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerArg1);
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerTarget,"CMAKE_",&ppVar7->second);
                                                  std::operator+(&local_158,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerTarget,"_COMPILER_ARG1");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_158);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_158);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerTarget);
                                                  local_138 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionTarget,"CMAKE_",&ppVar7->second);
                                                  std::operator+(&local_1a0,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionTarget,"_COMPILER_TARGET");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_1a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerOptionTarget);
                                                  local_180 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerExternalToolchain,"CMAKE_",
                                                  &ppVar7->second);
                                                  std::operator+(&local_1e8,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerExternalToolchain,
                                                  "_COMPILE_OPTIONS_TARGET");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_1e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerExternalToolchain);
                                                  local_1c8 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionExternalToolchain,"CMAKE_",
                                                  &ppVar7->second);
                                                  std::operator+(&local_230,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionExternalToolchain,
                                                  "_COMPILER_EXTERNAL_TOOLCHAIN");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_230);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_230);
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             &compilerOptionExternalToolchain);
                                                  local_210 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionSysroot,"CMAKE_",&ppVar7->second)
                                                  ;
                                                  std::operator+(&local_278,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionSysroot,
                                                  "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_278);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_278);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerOptionSysroot);
                                                  local_258 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  std::operator+(&local_2e0,"CMAKE_",&ppVar7->second
                                                                );
                                                  std::operator+(&local_2c0,&local_2e0,
                                                                 "_COMPILE_OPTIONS_SYSROOT");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_2c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2e0);
                                                  local_2a0 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_e0);
                                                  bVar2 = std::operator==(&ppVar7->second,
                                                                          this->ReplaceValues->
                                                                          Language);
                                                  if ((bVar2) &&
                                                     (this->ReplaceValues->Launcher != (char *)0x0))
                                                  {
                                                    cmAlphaNum::cmAlphaNum
                                                              (&local_330,
                                                               this->ReplaceValues->Launcher);
                                                    cmAlphaNum::cmAlphaNum(&local_360," ");
                                                    cmStrCat<std::__cxx11::string>
                                                              (&local_300,&local_330,&local_360,
                                                               __return_storage_ptr__);
                                                    std::__cxx11::string::operator=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)&local_300);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_300);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if ((uVar5 & 1) == 0) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_138);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if (((uVar5 & 1) == 0) &&
                                                     (uVar5 = std::__cxx11::string::empty(),
                                                     (uVar5 & 1) == 0)) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_1c8);
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_180);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if (((uVar5 & 1) == 0) &&
                                                     (uVar5 = std::__cxx11::string::empty(),
                                                     (uVar5 & 1) == 0)) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_258);
                                                    pcVar1 = this->OutputConverter;
                                                    sVar8 = (string_view)
                                                            std::__cxx11::string::
                                                            operator_cast_to_basic_string_view
                                                                      ((string *)local_210);
                                                    sysroot.field_2._8_8_ = sVar8._M_len;
                                                    cmOutputConverter::EscapeForShell_abi_cxx11_
                                                              (&local_380,pcVar1,sVar8,true,false,
                                                               false,false,false);
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)&local_380);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_380);
                                                  }
                                                  std::__cxx11::string::string(local_3b0);
                                                  if (this->ReplaceValues->LinkFlags == (char *)0x0)
                                                  {
                                                    std::__cxx11::string::operator=
                                                              (local_3b0,
                                                               (string *)&this->CompilerSysroot);
                                                  }
                                                  else {
                                                    std::__cxx11::string::operator=
                                                              (local_3b0,
                                                               (string *)&this->LinkerSysroot);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if (((uVar5 & 1) == 0) &&
                                                     (uVar5 = std::__cxx11::string::empty(),
                                                     (uVar5 & 1) == 0)) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_2a0);
                                                    pcVar1 = this->OutputConverter;
                                                    sVar8 = (string_view)
                                                            std::__cxx11::string::
                                                            operator_cast_to_basic_string_view
                                                                      (local_3b0);
                                                    mapIt._M_node = (_Base_ptr)sVar8._M_len;
                                                    cmOutputConverter::EscapeForShell_abi_cxx11_
                                                              (&local_3d0,pcVar1,sVar8,true,false,
                                                               false,false,false);
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)&local_3d0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_3d0);
                                                  }
                                                  local_e9 = 1;
                                                  local_bc = 1;
                                                  std::__cxx11::string::~string(local_3b0);
                                                  if ((local_e9 & 1) == 0) {
                                                    std::__cxx11::string::~string
                                                              ((string *)__return_storage_ptr__);
                                                  }
                                                  }
                                                  else {
                                                    local_3e8._M_node =
                                                         (_Base_ptr)
                                                         std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::find(&this->VariableMappings,local_20);
                                                  local_3f0._M_node =
                                                       (_Base_ptr)
                                                       std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::end(&this->VariableMappings);
                                                  bVar2 = std::operator!=(&local_3e8,&local_3f0);
                                                  if (bVar2) {
                                                    lVar6 = std::__cxx11::string::find
                                                                      ((char *)local_20,0xd58a1f);
                                                    if (lVar6 == -1) {
                                                      local_3f1 = 0;
                                                      pcVar1 = this->OutputConverter;
                                                      ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_3e8);
                                                  cmOutputConverter::ConvertToOutputForExisting
                                                            (__return_storage_ptr__,pcVar1,
                                                             &ppVar7->second,SHELL);
                                                  if ((this->ReplaceValues->Launcher != (char *)0x0)
                                                     && (bVar2 = std::operator==(local_20,
                                                  "CMAKE_LINKER"), bVar2)) {
                                                    cmAlphaNum::cmAlphaNum
                                                              (&local_448,
                                                               this->ReplaceValues->Launcher);
                                                    cmAlphaNum::cmAlphaNum(&local_478," ");
                                                    cmStrCat<std::__cxx11::string>
                                                              (&local_418,&local_448,&local_478,
                                                               __return_storage_ptr__);
                                                    std::__cxx11::string::operator=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)&local_418);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_418);
                                                  }
                                                  }
                                                  else {
                                                    ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_3e8);
                                                  std::__cxx11::string::string
                                                            ((string *)__return_storage_ptr__,
                                                             (string *)&ppVar7->second);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::string
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_20);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->Output;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c5);
                                                    std::allocator<char>::~allocator(&local_c5);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->CMTargetType;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c4);
                                                    std::allocator<char>::~allocator(&local_c4);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->CMTargetName;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c3);
                                                    std::allocator<char>::~allocator(&local_c3);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->Language;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c2);
                                                    std::allocator<char>::~allocator(&local_c2);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->LinkLibraries;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c1);
                                                    std::allocator<char>::~allocator(&local_c1);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->RegisterFile;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_4e);
                                                    std::allocator<char>::~allocator(&local_4e);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->Fatbinary;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_4d);
                                                    std::allocator<char>::~allocator(&local_4d);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = this->ReplaceValues->DependencyTarget;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_4c);
                                                    std::allocator<char>::~allocator(&local_4c);
                                                  }
                                                }
                                                else {
                                                  pcVar3 = this->ReplaceValues->DependencyFile;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)__return_storage_ptr__,pcVar3
                                                             ,&local_4b);
                                                  std::allocator<char>::~allocator(&local_4b);
                                                }
                                              }
                                              else {
                                                pcVar3 = this->ReplaceValues->TargetCompilePDB;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)__return_storage_ptr__,pcVar3,
                                                           &local_4a);
                                                std::allocator<char>::~allocator(&local_4a);
                                              }
                                            }
                                            else {
                                              pcVar3 = this->ReplaceValues->TargetPDB;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)__return_storage_ptr__,pcVar3,
                                                         &local_49);
                                              std::allocator<char>::~allocator(&local_49);
                                            }
                                          }
                                          else {
                                            pcVar3 = this->ReplaceValues->SwiftSources;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)__return_storage_ptr__,pcVar3,
                                                       &local_48);
                                            std::allocator<char>::~allocator(&local_48);
                                          }
                                        }
                                        else {
                                          pcVar3 = this->ReplaceValues->SwiftModuleName;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)__return_storage_ptr__,pcVar3,
                                                     &local_47);
                                          std::allocator<char>::~allocator(&local_47);
                                        }
                                      }
                                      else {
                                        pcVar3 = this->ReplaceValues->SwiftModule;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)__return_storage_ptr__,pcVar3,&local_46
                                                  );
                                        std::allocator<char>::~allocator(&local_46);
                                      }
                                    }
                                    else {
                                      pcVar3 = this->ReplaceValues->SwiftLibraryName;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,pcVar3,&local_45);
                                      std::allocator<char>::~allocator(&local_45);
                                    }
                                  }
                                  else {
                                    pcVar3 = this->ReplaceValues->Includes;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)__return_storage_ptr__,pcVar3,&local_44);
                                    std::allocator<char>::~allocator(&local_44);
                                  }
                                }
                                else {
                                  pcVar3 = this->ReplaceValues->Defines;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)__return_storage_ptr__,pcVar3,&local_43);
                                  std::allocator<char>::~allocator(&local_43);
                                }
                              }
                              else {
                                pcVar3 = this->ReplaceValues->ISPCHeader;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)__return_storage_ptr__,pcVar3,&local_42);
                                std::allocator<char>::~allocator(&local_42);
                              }
                            }
                            else {
                              pcVar3 = this->ReplaceValues->AIXExports;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)__return_storage_ptr__,pcVar3,&local_41);
                              std::allocator<char>::~allocator(&local_41);
                            }
                          }
                          else {
                            pcVar3 = this->ReplaceValues->CudaCompileMode;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,pcVar3,&local_40);
                            std::allocator<char>::~allocator(&local_40);
                          }
                        }
                        else {
                          pcVar3 = this->ReplaceValues->ObjectsQuoted;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,pcVar3,&local_3f);
                          std::allocator<char>::~allocator(&local_3f);
                        }
                      }
                      else {
                        pcVar3 = this->ReplaceValues->Objects;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,pcVar3,&local_3e);
                        std::allocator<char>::~allocator(&local_3e);
                      }
                    }
                    else {
                      pcVar3 = this->ReplaceValues->ObjectFileDir;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar3,&local_3d);
                      std::allocator<char>::~allocator(&local_3d);
                    }
                  }
                  else {
                    pcVar3 = this->ReplaceValues->ObjectDir;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,pcVar3,&local_3c);
                    std::allocator<char>::~allocator(&local_3c);
                  }
                }
                else {
                  pcVar3 = this->ReplaceValues->Object;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,pcVar3,&local_3b);
                  std::allocator<char>::~allocator(&local_3b);
                }
              }
              else {
                pcVar3 = this->ReplaceValues->AssemblySource;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,pcVar3,&local_3a);
                std::allocator<char>::~allocator(&local_3a);
              }
            }
            else {
              pcVar3 = this->ReplaceValues->PreprocessedSource;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,pcVar3,&local_39);
              std::allocator<char>::~allocator(&local_39);
            }
          }
          else {
            pcVar3 = this->ReplaceValues->DynDepFile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,pcVar3,&local_38);
            std::allocator<char>::~allocator(&local_38);
          }
        }
        else {
          pcVar3 = this->ReplaceValues->Source;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar3,&local_37);
          std::allocator<char>::~allocator(&local_37);
        }
      }
      else {
        pcVar3 = this->ReplaceValues->Flags;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar3,&local_36);
        std::allocator<char>::~allocator(&local_36);
      }
    }
    else {
      pcVar3 = this->ReplaceValues->Manifests;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,local_35);
      std::allocator<char>::~allocator(local_35);
    }
  }
  else {
    pcVar3 = this->ReplaceValues->LinkFlags;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandVariable(
  std::string const& variable)
{
  if (this->ReplaceValues->LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return this->ReplaceValues->LinkFlags;
    }
  }
  if (this->ReplaceValues->Manifests) {
    if (variable == "MANIFESTS") {
      return this->ReplaceValues->Manifests;
    }
  }
  if (this->ReplaceValues->Flags) {
    if (variable == "FLAGS") {
      return this->ReplaceValues->Flags;
    }
  }

  if (this->ReplaceValues->Source) {
    if (variable == "SOURCE") {
      return this->ReplaceValues->Source;
    }
  }
  if (this->ReplaceValues->DynDepFile) {
    if (variable == "DYNDEP_FILE") {
      return this->ReplaceValues->DynDepFile;
    }
  }
  if (this->ReplaceValues->PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return this->ReplaceValues->PreprocessedSource;
    }
  }
  if (this->ReplaceValues->AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return this->ReplaceValues->AssemblySource;
    }
  }
  if (this->ReplaceValues->Object) {
    if (variable == "OBJECT") {
      return this->ReplaceValues->Object;
    }
  }
  if (this->ReplaceValues->ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return this->ReplaceValues->ObjectDir;
    }
  }
  if (this->ReplaceValues->ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return this->ReplaceValues->ObjectFileDir;
    }
  }
  if (this->ReplaceValues->Objects) {
    if (variable == "OBJECTS") {
      return this->ReplaceValues->Objects;
    }
  }
  if (this->ReplaceValues->ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return this->ReplaceValues->ObjectsQuoted;
    }
  }
  if (this->ReplaceValues->CudaCompileMode) {
    if (variable == "CUDA_COMPILE_MODE") {
      return this->ReplaceValues->CudaCompileMode;
    }
  }
  if (this->ReplaceValues->AIXExports) {
    if (variable == "AIX_EXPORTS") {
      return this->ReplaceValues->AIXExports;
    }
  }
  if (this->ReplaceValues->ISPCHeader) {
    if (variable == "ISPC_HEADER") {
      return this->ReplaceValues->ISPCHeader;
    }
  }
  if (this->ReplaceValues->Defines && variable == "DEFINES") {
    return this->ReplaceValues->Defines;
  }
  if (this->ReplaceValues->Includes && variable == "INCLUDES") {
    return this->ReplaceValues->Includes;
  }
  if (this->ReplaceValues->SwiftLibraryName) {
    if (variable == "SWIFT_LIBRARY_NAME") {
      return this->ReplaceValues->SwiftLibraryName;
    }
  }
  if (this->ReplaceValues->SwiftModule) {
    if (variable == "SWIFT_MODULE") {
      return this->ReplaceValues->SwiftModule;
    }
  }
  if (this->ReplaceValues->SwiftModuleName) {
    if (variable == "SWIFT_MODULE_NAME") {
      return this->ReplaceValues->SwiftModuleName;
    }
  }
  if (this->ReplaceValues->SwiftSources) {
    if (variable == "SWIFT_SOURCES") {
      return this->ReplaceValues->SwiftSources;
    }
  }
  if (this->ReplaceValues->TargetPDB) {
    if (variable == "TARGET_PDB") {
      return this->ReplaceValues->TargetPDB;
    }
  }
  if (this->ReplaceValues->TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return this->ReplaceValues->TargetCompilePDB;
    }
  }
  if (this->ReplaceValues->DependencyFile) {
    if (variable == "DEP_FILE") {
      return this->ReplaceValues->DependencyFile;
    }
  }
  if (this->ReplaceValues->DependencyTarget) {
    if (variable == "DEP_TARGET") {
      return this->ReplaceValues->DependencyTarget;
    }
  }
  if (this->ReplaceValues->Fatbinary) {
    if (variable == "FATBINARY") {
      return this->ReplaceValues->Fatbinary;
    }
  }
  if (this->ReplaceValues->RegisterFile) {
    if (variable == "REGISTER_FILE") {
      return this->ReplaceValues->RegisterFile;
    }
  }

  if (this->ReplaceValues->Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = this->ReplaceValues->Target;
      if (!targetQuoted.empty() && targetQuoted.front() != '\"') {
        targetQuoted = '\"';
        targetQuoted += this->ReplaceValues->Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = this->ReplaceValues->Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted.front() == '\"' && unquoted.back() == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (this->ReplaceValues->LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return this->ReplaceValues->LanguageCompileFlags;
      }
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET") {
        return this->ReplaceValues->Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (this->ReplaceValues->TargetVersionMajor) {
        return this->ReplaceValues->TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (this->ReplaceValues->TargetVersionMinor) {
        return this->ReplaceValues->TargetVersionMinor;
      }
      return "0";
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = this->ReplaceValues->Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (this->ReplaceValues->TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return this->ReplaceValues->TargetSOName;
      }
      if (variable == "SONAME_FLAG" && this->ReplaceValues->SONameFlag) {
        return this->ReplaceValues->SONameFlag;
      }
      if (this->ReplaceValues->TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return this->ReplaceValues->TargetInstallNameDir;
      }
    }
    return "";
  }
  if (this->ReplaceValues->LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return this->ReplaceValues->LinkLibraries;
    }
  }
  if (this->ReplaceValues->Language) {
    if (variable == "LANGUAGE") {
      return this->ReplaceValues->Language;
    }
  }
  if (this->ReplaceValues->CMTargetName) {
    if (variable == "TARGET_NAME") {
      return this->ReplaceValues->CMTargetName;
    }
  }
  if (this->ReplaceValues->CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return this->ReplaceValues->CMTargetType;
    }
  }
  if (this->ReplaceValues->Output) {
    if (variable == "OUTPUT") {
      return this->ReplaceValues->Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return this->OutputConverter->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
  }

  auto compIt = this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = this->OutputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    if (compIt->second == this->ReplaceValues->Language &&
        this->ReplaceValues->Launcher) {
      // Add launcher as part of expansion so that it always appears
      // immediately before the command itself, regardless of whether the
      // overall rule template contains other content at the front.
      ret = cmStrCat(this->ReplaceValues->Launcher, " ", ret);
    }

    // if there are required arguments to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret +=
        this->OutputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (this->ReplaceValues->LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += this->OutputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  auto mapIt = this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      std::string ret =
        this->OutputConverter->ConvertToOutputForExisting(mapIt->second);

      if (this->ReplaceValues->Launcher && variable == "CMAKE_LINKER") {
        // Add launcher as part of expansion so that it always appears
        // immediately before the command itself, regardless of whether the
        // overall rule template contains other content at the front.
        ret = cmStrCat(this->ReplaceValues->Launcher, " ", ret);
      }

      return ret;
    }
    return mapIt->second;
  }
  return variable;
}